

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O2

uint64_t __thiscall
jessilib::text_hash::operator()
          (text_hash *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_key
          )

{
  text_hash *this_00;
  uint64_t uVar1;
  char *in_RDX;
  
  this_00 = (text_hash *)(in_key->_M_dataplus)._M_p;
  uVar1 = hash<char>(this_00,(char *)(this_00 + in_key->_M_string_length),in_RDX);
  return uVar1;
}

Assistant:

auto operator()(const std::basic_string<char>& in_key) const noexcept { // ASSUMES UTF-8
		return hash(in_key.data(), in_key.data() + in_key.size());
	}